

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fail_function.hpp
# Opt level: O3

bool __thiscall
boost::spirit::qi::detail::
fail_function<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type>
::operator()(void *this,
            action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,_(boost::spirit::endian::endianness)0,_16>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>_>
            *component,unused_type *attr)

{
  char *pcVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  uint *puVar5;
  long lVar6;
  type attr_;
  
  plVar2 = *this;
  lVar3 = *plVar2;
  pcVar4 = (char *)**(undefined8 **)((long)this + 8);
  lVar6 = 0;
  do {
    pcVar1 = (char *)(lVar3 + lVar6);
    if (pcVar1 == pcVar4) goto LAB_0014ad2f;
    attr_.m_value[lVar6] = *pcVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  *plVar2 = lVar3 + 2;
  puVar5 = (component->f).proto_expr_.child0.proto_expr_.child0.t_;
  *puVar5 = *puVar5 + (uint)(ushort)((short)attr_.m_value << 8 | (ushort)attr_.m_value >> 8) +
                      (component->f).proto_expr_.child1.proto_expr_.child1.proto_expr_.child0;
LAB_0014ad2f:
  return pcVar1 == pcVar4;
}

Assistant:

bool operator()(Component const& component, Attribute& attr) const
        {
            // return true if the parser fails
            return !component.parse(first, last, context, skipper, attr);
        }